

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FSoundID *sid,FSoundID *def)

{
  FSoundID *this;
  bool bVar1;
  Value *this_00;
  Ch *cc;
  char *pcVar2;
  bool local_49;
  Value *val;
  char *sn;
  FSoundID *local_28;
  FSoundID *def_local;
  FSoundID *sid_local;
  char *key_local;
  FSerializer *arc_local;
  
  local_28 = def;
  def_local = sid;
  sid_local = (FSoundID *)key;
  key_local = (char *)arc;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(*(FWriter **)key_local);
    this = def_local;
    if ((bVar1) && (local_28 != (FSoundID *)0x0)) {
      FSoundID::FSoundID((FSoundID *)((long)&sn + 4),local_28);
      bVar1 = FSoundID::operator!=(this,(FSoundID *)((long)&sn + 4));
      if (!bVar1) {
        return (FSerializer *)key_local;
      }
    }
    FSerializer::WriteKey((FSerializer *)key_local,(char *)sid_local);
    pcVar2 = FSoundID::operator_cast_to_char_(def_local);
    if (pcVar2 == (char *)0x0) {
      FWriter::Null(*(FWriter **)key_local);
    }
    else {
      FWriter::String(*(FWriter **)key_local,pcVar2);
    }
  }
  else {
    this_00 = FReader::FindKey(*(FReader **)(key_local + 8),(char *)sid_local);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      local_49 = true;
      if (!bVar1) {
        local_49 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsNull(this_00);
      }
      if (local_49 == false) {
        __assert_fail("val->IsString() || val->IsNull()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x6f2,
                      "FSerializer &Serialize(FSerializer &, const char *, FSoundID &, FSoundID *)")
        ;
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      if (bVar1) {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar2 = UnicodeToString(cc);
        FSoundID::operator=(def_local,pcVar2);
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsNull(this_00);
        if (bVar1) {
          FSoundID::operator=(def_local,(char *)0x0);
        }
        else {
          Printf("\x1cGstring type expected for \'%s\'",sid_local);
          FSoundID::operator=(def_local,(char *)0x0);
          *(int *)(key_local + 0x10) = *(int *)(key_local + 0x10) + 1;
        }
      }
    }
  }
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSoundID &sid, FSoundID *def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || sid != *def)
		{
			arc.WriteKey(key);
			const char *sn = (const char*)sid;
			if (sn != nullptr) arc.w->String(sn);
			else arc.w->Null();
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsString() || val->IsNull());
			if (val->IsString())
			{
				sid = UnicodeToString(val->GetString());
			}
			else if (val->IsNull())
			{
				sid = 0;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				sid = 0;
				arc.mErrors++;
			}
		}
	}
	return arc;

}